

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectDumper.cpp
# Opt level: O0

BOOL RecyclerObjectDumper::EnsureDumpFunctionMap(void)

{
  NoCheckHeapAllocator *alloc;
  BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  TrackAllocData local_30;
  
  if (dumpFunctionMap == (DumpFunctionMap *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_30,
               (type_info *)
               &JsUtil::
                BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerObjectDumper.cpp"
               ,0x27);
    alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                      ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_30);
    this = (BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::NoCheckHeapAllocator>(0x38,alloc,0x25f760);
    JsUtil::
    BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this,(AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,0);
    dumpFunctionMap = this;
  }
  return (BOOL)(dumpFunctionMap != (DumpFunctionMap *)0x0);
}

Assistant:

BOOL
RecyclerObjectDumper::EnsureDumpFunctionMap()
{
    if (dumpFunctionMap == nullptr)
    {
        dumpFunctionMap = NoCheckHeapNew(DumpFunctionMap, &NoCheckHeapAllocator::Instance);
    }
    return (dumpFunctionMap != nullptr);
}